

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall
CVmObjTable::for_each(CVmObjTable *this,_func_void_vm_obj_id_t_void_ptr *func,void *ctx)

{
  undefined8 in_RDX;
  code *in_RSI;
  long in_RDI;
  CVmObjPageEntry *entry;
  size_t j;
  vm_obj_id_t id;
  size_t i;
  CVmObjPageEntry **pg;
  long local_40;
  long local_38;
  int local_2c;
  long local_28;
  long *local_20;
  
  local_2c = 0;
  local_20 = *(long **)(in_RDI + 0x18);
  for (local_28 = *(long *)(in_RDI + 0x28); local_28 != 0; local_28 = local_28 + -1) {
    local_38 = 0x1000;
    local_40 = *local_20;
    for (; local_38 != 0; local_38 = local_38 + -1) {
      if ((*(ushort *)(local_40 + 0x14) & 1) == 0) {
        (*in_RSI)(local_2c,in_RDX);
      }
      local_40 = local_40 + 0x18;
      local_2c = local_2c + 1;
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void CVmObjTable::for_each(VMG_ void (*func)(VMG_ vm_obj_id_t, void *),
                           void *ctx)
{
    CVmObjPageEntry **pg;
    size_t i;
    vm_obj_id_t id;

    /* go through each page in the object table */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* start at the start of the page */
        size_t j = VM_OBJ_PAGE_CNT;
        CVmObjPageEntry *entry = *pg;

        /* go through each entry on this page */
        for ( ; j > 0 ; --j, ++entry, ++id)
        {
            /* if this entry is in use, invoke the callback */
            if (!entry->free_)
                (*func)(vmg_ id, ctx);
        }
    }
}